

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDTDDescriptionImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XMLDTDDescriptionImpl::XMLDTDDescriptionImpl
          (XMLDTDDescriptionImpl *this,XMLCh *systemId,MemoryManager *memMgr)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  
  XMLDTDDescription::XMLDTDDescription(&this->super_XMLDTDDescription,memMgr);
  (this->super_XMLDTDDescription).super_XMLGrammarDescription.super_XSerializable.
  _vptr_XSerializable = (_func_int **)&PTR__XMLDTDDescriptionImpl_0040e2c8;
  this->fSystemId = (XMLCh *)0x0;
  this->fRootName = (XMLCh *)0x0;
  if (systemId != (XMLCh *)0x0) {
    __n = 0;
    do {
      psVar1 = (short *)((long)systemId + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,__n);
    memcpy((XMLCh *)CONCAT44(extraout_var,iVar2),systemId,__n);
    this->fSystemId = (XMLCh *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

XMLDTDDescriptionImpl::XMLDTDDescriptionImpl(const XMLCh*          const  systemId
                                           ,       MemoryManager*  const  memMgr  )
:XMLDTDDescription(memMgr)
,fSystemId(0)
,fRootName(0)
{
    if (systemId)
        fSystemId = XMLString::replicate(systemId, memMgr);
}